

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O3

double formula_eval(rpf_t *rpf)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double *stack [512];
  double _stack [512];
  double *local_2018 [512];
  double adStack_1018 [512];
  
  iVar2 = 0;
  do {
    lVar3 = (long)iVar2;
    if ((rpf->type & ~TYPE_VARIABLE) == TYPE_VALUE) {
      local_2018[lVar3] = (double *)rpf->value;
    }
    else {
      pvVar1 = rpf->value;
      dVar4 = (double)(**(code **)((long)pvVar1 + 0x10))
                                (local_2018 + (lVar3 - *(int *)((long)pvVar1 + 0x18)));
      lVar3 = lVar3 - *(int *)((long)pvVar1 + 0x18);
      local_2018[lVar3] = adStack_1018 + lVar3;
      adStack_1018[lVar3] = dVar4;
      iVar2 = (int)lVar3;
    }
    iVar2 = iVar2 + 1;
    rpf = rpf->next;
  } while (rpf != (rpf_t *)0x0);
  return *local_2018[0];
}

Assistant:

double formula_eval(struct rpf_t *rpf)
{
  double _stack[512];
  double *stack[512];
  int sp;
  struct operation_t *op;
  double tmp;

  sp = 0;
  for (; rpf; rpf = rpf->next)
  {
    switch (rpf->type)
    {
      case TYPE_VALUE:
      case TYPE_VARIABLE:
        stack[sp] = ((double *)rpf->value);
        sp++;
        break;
      default:
        op = (struct operation_t *)rpf->value;
        tmp = (op->func)(&stack[sp - op->narg]);
        sp -= op->narg;
        stack[sp] = &_stack[sp];
        _stack[sp] = tmp;
        sp++;
        break;
    }
  }
  return *stack[0];
}